

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

bool __thiscall cmGlobalNinjaMultiGenerator::OpenBuildFileStreams(cmGlobalNinjaMultiGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmGeneratedFileStream *pcVar2;
  bool bVar3;
  ostream *poVar4;
  long lVar5;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __it;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var6;
  cmGlobalNinjaMultiGenerator *local_58;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,NINJA_COMMON_FILE,(allocator<char> *)&local_58);
  bVar3 = cmGlobalNinjaGenerator::OpenFileStream
                    (&this->super_cmGlobalNinjaGenerator,&this->CommonFileStream,&local_50);
  paVar1 = &local_50.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    return false;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,cmGlobalNinjaGenerator::NINJA_BUILD_FILE,
             (allocator<char> *)&local_58);
  bVar3 = cmGlobalNinjaGenerator::OpenFileStream
                    (&this->super_cmGlobalNinjaGenerator,&this->DefaultFileStream,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    return false;
  }
  pcVar2 = (this->DefaultFileStream)._M_t.
           super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
           .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pcVar2,"# Build using rules for \'",0x19);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)pcVar2,
                      (this->super_cmGlobalNinjaGenerator).DefaultFileConfig._M_dataplus._M_p,
                      (this->super_cmGlobalNinjaGenerator).DefaultFileConfig._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'.\n\n",4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"include ",8);
  GetNinjaImplFilename(&local_50,&(this->super_cmGlobalNinjaGenerator).DefaultFileConfig);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)
             (this->CommonFileStream)._M_t.
             super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
             .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
             "# This file contains build statements common to all configurations.\n\n",0x45);
  cmMakefile::GetGeneratorConfigs_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_50,
             (cmMakefile *)
             (((this->super_cmGlobalNinjaGenerator).super_cmGlobalCommonGenerator.
               super_cmGlobalGenerator.Makefiles.
               super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
             super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t,
             IncludeEmptyConfig);
  lVar5 = (long)(local_50._M_string_length - (long)local_50._M_dataplus._M_p) >> 7;
  __it._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       local_50._M_dataplus._M_p;
  local_58 = this;
  if (0 < lVar5) {
    lVar5 = lVar5 + 1;
    do {
      bVar3 = __gnu_cxx::__ops::
              _Iter_negate<cmGlobalNinjaMultiGenerator::OpenBuildFileStreams()::$_0>::operator()
                        ((_Iter_negate<cmGlobalNinjaMultiGenerator::OpenBuildFileStreams()::__0> *)
                         &local_58,__it);
      _Var6._M_current = __it._M_current;
      if (bVar3) goto LAB_003f4815;
      bVar3 = __gnu_cxx::__ops::
              _Iter_negate<cmGlobalNinjaMultiGenerator::OpenBuildFileStreams()::$_0>::operator()
                        ((_Iter_negate<cmGlobalNinjaMultiGenerator::OpenBuildFileStreams()::__0> *)
                         &local_58,__it._M_current + 1);
      _Var6._M_current = __it._M_current + 1;
      if (bVar3) goto LAB_003f4815;
      bVar3 = __gnu_cxx::__ops::
              _Iter_negate<cmGlobalNinjaMultiGenerator::OpenBuildFileStreams()::$_0>::operator()
                        ((_Iter_negate<cmGlobalNinjaMultiGenerator::OpenBuildFileStreams()::__0> *)
                         &local_58,__it._M_current + 2);
      _Var6._M_current = __it._M_current + 2;
      if (bVar3) goto LAB_003f4815;
      bVar3 = __gnu_cxx::__ops::
              _Iter_negate<cmGlobalNinjaMultiGenerator::OpenBuildFileStreams()::$_0>::operator()
                        ((_Iter_negate<cmGlobalNinjaMultiGenerator::OpenBuildFileStreams()::__0> *)
                         &local_58,__it._M_current + 3);
      _Var6._M_current = __it._M_current + 3;
      if (bVar3) goto LAB_003f4815;
      __it._M_current = __it._M_current + 4;
      lVar5 = lVar5 + -1;
    } while (1 < lVar5);
  }
  lVar5 = (long)(local_50._M_string_length - (long)__it._M_current) >> 5;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      _Var6._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           local_50._M_string_length;
      if ((lVar5 != 3) ||
         (bVar3 = __gnu_cxx::__ops::
                  _Iter_negate<cmGlobalNinjaMultiGenerator::OpenBuildFileStreams()::$_0>::operator()
                            ((_Iter_negate<cmGlobalNinjaMultiGenerator::OpenBuildFileStreams()::__0>
                              *)&local_58,__it), _Var6._M_current = __it._M_current, bVar3))
      goto LAB_003f4815;
      __it._M_current = __it._M_current + 1;
    }
    bVar3 = __gnu_cxx::__ops::_Iter_negate<cmGlobalNinjaMultiGenerator::OpenBuildFileStreams()::$_0>
            ::operator()((_Iter_negate<cmGlobalNinjaMultiGenerator::OpenBuildFileStreams()::__0> *)
                         &local_58,__it);
    _Var6._M_current = __it._M_current;
    if (bVar3) goto LAB_003f4815;
    __it._M_current = __it._M_current + 1;
  }
  bVar3 = __gnu_cxx::__ops::_Iter_negate<cmGlobalNinjaMultiGenerator::OpenBuildFileStreams()::$_0>::
          operator()((_Iter_negate<cmGlobalNinjaMultiGenerator::OpenBuildFileStreams()::__0> *)
                     &local_58,__it);
  _Var6._M_current = __it._M_current;
  if (!bVar3) {
    _Var6._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         local_50._M_string_length;
  }
LAB_003f4815:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_50);
  return _Var6._M_current ==
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         local_50._M_string_length;
}

Assistant:

bool cmGlobalNinjaMultiGenerator::OpenBuildFileStreams()
{
  if (!this->OpenFileStream(this->CommonFileStream,
                            cmGlobalNinjaMultiGenerator::NINJA_COMMON_FILE)) {
    return false;
  }

  if (!this->OpenFileStream(this->DefaultFileStream, NINJA_BUILD_FILE)) {
    return false;
  }
  *this->DefaultFileStream << "# Build using rules for '"
                           << this->DefaultFileConfig << "'.\n\n"
                           << "include "
                           << GetNinjaImplFilename(this->DefaultFileConfig)
                           << "\n\n";

  // Write a comment about this file.
  *this->CommonFileStream
    << "# This file contains build statements common to all "
       "configurations.\n\n";

  auto const& configs =
    this->Makefiles[0]->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);
  return std::all_of(
    configs.begin(), configs.end(), [this](std::string const& config) -> bool {
      // Open impl file.
      if (!this->OpenFileStream(this->ImplFileStreams[config],
                                GetNinjaImplFilename(config))) {
        return false;
      }

      // Write a comment about this file.
      *this->ImplFileStreams[config]
        << "# This file contains build statements specific to the \"" << config
        << "\"\n# configuration.\n\n";

      // Open config file.
      if (!this->OpenFileStream(this->ConfigFileStreams[config],
                                GetNinjaConfigFilename(config))) {
        return false;
      }

      // Write a comment about this file.
      *this->ConfigFileStreams[config]
        << "# This file contains aliases specific to the \"" << config
        << "\"\n# configuration.\n\n"
        << "include " << GetNinjaImplFilename(config) << "\n\n";

      return true;
    });
}